

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

void getIntelProcessorTypeAndSubtype
               (uint Family,uint Model,uint Brand_id,uint Features,uint Features2,uint *Type,
               uint *Subtype)

{
  uint *Type_local;
  uint Features2_local;
  uint Features_local;
  uint Brand_id_local;
  uint Model_local;
  uint Family_local;
  
  if (Brand_id == 0) {
    switch(Family) {
    case 3:
      *Type = 0xc;
      break;
    case 4:
      *Type = 0xd;
      break;
    case 5:
      if ((Features & 2) == 0) {
        *Type = 0xe;
      }
      else {
        *Type = 0xf;
      }
      break;
    case 6:
      switch(Model) {
      case 1:
        *Type = 0x10;
        break;
      default:
        if ((Features & 0x4000000) == 0) {
          if ((Features & 0x100000) == 0) {
            if ((Features & 0x1000000) == 0) {
              if ((Features2 & 8) == 0) {
                if ((Features2 & 2) == 0) {
                  if ((Features & 0x400) == 0) {
                    if ((Features & 0x200) == 0) {
                      if ((Features & 0x100) == 0) {
                        if ((Features & 0x80) == 0) {
                          if ((Features & 0x40) == 0) {
                            if ((Features2 & 4) == 0) {
                              if ((Features & 0x20) == 0) {
                                if ((Features & 0x10) == 0) {
                                  if ((Features & 8) == 0) {
                                    if ((Features & 2) == 0) {
                                      *Type = 0x10;
                                    }
                                    else {
                                      *Type = 0x11;
                                    }
                                  }
                                  else {
                                    *Type = 0x12;
                                  }
                                }
                                else {
                                  *Type = 0x14;
                                }
                              }
                              else {
                                *Type = 0x15;
                              }
                            }
                            else {
                              *Type = 2;
                              *Subtype = 0x12;
                            }
                          }
                          else if ((Features2 & 1) == 0) {
                            *Type = 2;
                            *Subtype = 0x12;
                          }
                          else {
                            *Type = 1;
                          }
                        }
                        else {
                          *Type = 2;
                          *Subtype = 0x13;
                        }
                      }
                      else if ((Features2 & 1) == 0) {
                        *Type = 3;
                        *Subtype = 1;
                      }
                      else {
                        *Type = 6;
                      }
                    }
                    else {
                      *Type = 3;
                      *Subtype = 3;
                    }
                  }
                  else {
                    *Type = 3;
                    *Subtype = 0xd;
                  }
                }
                else {
                  *Type = 3;
                  *Subtype = 0xe;
                }
              }
              else if ((Features2 & 0x10) == 0) {
                *Type = 3;
                *Subtype = 0xf;
              }
              else {
                *Type = 0x1e;
              }
            }
            else {
              *Type = 7;
            }
          }
          else {
            *Type = 3;
            *Subtype = 0x10;
          }
        }
        else {
          *Type = 3;
          *Subtype = 0x11;
        }
        break;
      case 3:
      case 5:
      case 6:
        *Type = 0x11;
        break;
      case 7:
      case 8:
      case 10:
      case 0xb:
        *Type = 0x12;
        break;
      case 9:
      case 0xd:
      case 0x15:
        *Type = 0x14;
        break;
      case 0xe:
        *Type = 0x15;
        break;
      case 0xf:
      case 0x16:
        *Type = 2;
        *Subtype = 0x12;
        break;
      case 0x17:
      case 0x1d:
        *Type = 2;
        *Subtype = 0x13;
        break;
      case 0x1a:
      case 0x1e:
      case 0x1f:
      case 0x2e:
        *Type = 3;
        *Subtype = 1;
        break;
      case 0x1c:
      case 0x26:
      case 0x27:
      case 0x35:
      case 0x36:
        *Type = 1;
        break;
      case 0x25:
      case 0x2c:
      case 0x2f:
        *Type = 3;
        *Subtype = 2;
        break;
      case 0x2a:
      case 0x2d:
        *Type = 3;
        *Subtype = 3;
        break;
      case 0x37:
      case 0x4a:
      case 0x4c:
      case 0x4d:
      case 0x5a:
      case 0x5d:
        *Type = 6;
        break;
      case 0x3a:
      case 0x3e:
        *Type = 3;
        *Subtype = 0xc;
        break;
      case 0x3c:
      case 0x3f:
      case 0x45:
      case 0x46:
        *Type = 3;
        *Subtype = 0xd;
        break;
      case 0x3d:
      case 0x47:
      case 0x4f:
      case 0x56:
        *Type = 3;
        *Subtype = 0xe;
        break;
      case 0x4e:
      case 0x5e:
      case 0x8e:
      case 0x9e:
        *Type = 3;
        *Subtype = 0xf;
        break;
      case 0x55:
        *Type = 3;
        *Subtype = 0x10;
        break;
      case 0x57:
        *Type = 7;
        break;
      case 0x5c:
      case 0x5f:
        *Type = 0x1e;
        break;
      case 0x66:
        *Type = 3;
        *Subtype = 0x11;
        break;
      case 0x7a:
        *Type = 0x1f;
        break;
      case 0x85:
        *Type = 0xb;
      }
      break;
    default:
      break;
    case 0xf:
      if ((Features2 & 4) == 0) {
        if ((Features & 0x20) == 0) {
          *Type = 0x13;
        }
        else {
          *Type = 0x17;
        }
      }
      else {
        *Type = 0x16;
      }
    }
  }
  return;
}

Assistant:

static void
getIntelProcessorTypeAndSubtype(unsigned Family, unsigned Model,
                                unsigned Brand_id, unsigned Features,
                                unsigned Features2, unsigned *Type,
                                unsigned *Subtype) {
  if (Brand_id != 0)
    return;
  switch (Family) {
  case 3:
    *Type = X86::INTEL_i386;
    break;
  case 4:
    *Type = X86::INTEL_i486;
    break;
  case 5:
    if (Features & (1 << X86::FEATURE_MMX)) {
      *Type = X86::INTEL_PENTIUM_MMX;
      break;
    }
    *Type = X86::INTEL_PENTIUM;
    break;
  case 6:
    switch (Model) {
    case 0x01: // Pentium Pro processor
      *Type = X86::INTEL_PENTIUM_PRO;
      break;
    case 0x03: // Intel Pentium II OverDrive processor, Pentium II processor,
               // model 03
    case 0x05: // Pentium II processor, model 05, Pentium II Xeon processor,
               // model 05, and Intel Celeron processor, model 05
    case 0x06: // Celeron processor, model 06
      *Type = X86::INTEL_PENTIUM_II;
      break;
    case 0x07: // Pentium III processor, model 07, and Pentium III Xeon
               // processor, model 07
    case 0x08: // Pentium III processor, model 08, Pentium III Xeon processor,
               // model 08, and Celeron processor, model 08
    case 0x0a: // Pentium III Xeon processor, model 0Ah
    case 0x0b: // Pentium III processor, model 0Bh
      *Type = X86::INTEL_PENTIUM_III;
      break;
    case 0x09: // Intel Pentium M processor, Intel Celeron M processor model 09.
    case 0x0d: // Intel Pentium M processor, Intel Celeron M processor, model
               // 0Dh. All processors are manufactured using the 90 nm process.
    case 0x15: // Intel EP80579 Integrated Processor and Intel EP80579
               // Integrated Processor with Intel QuickAssist Technology
      *Type = X86::INTEL_PENTIUM_M;
      break;
    case 0x0e: // Intel Core Duo processor, Intel Core Solo processor, model
               // 0Eh. All processors are manufactured using the 65 nm process.
      *Type = X86::INTEL_CORE_DUO;
      break;   // yonah
    case 0x0f: // Intel Core 2 Duo processor, Intel Core 2 Duo mobile
               // processor, Intel Core 2 Quad processor, Intel Core 2 Quad
               // mobile processor, Intel Core 2 Extreme processor, Intel
               // Pentium Dual-Core processor, Intel Xeon processor, model
               // 0Fh. All processors are manufactured using the 65 nm process.
    case 0x16: // Intel Celeron processor model 16h. All processors are
               // manufactured using the 65 nm process
      *Type = X86::INTEL_CORE2; // "core2"
      *Subtype = X86::INTEL_CORE2_65;
      break;
    case 0x17: // Intel Core 2 Extreme processor, Intel Xeon processor, model
               // 17h. All processors are manufactured using the 45 nm process.
               //
               // 45nm: Penryn , Wolfdale, Yorkfield (XE)
    case 0x1d: // Intel Xeon processor MP. All processors are manufactured using
               // the 45 nm process.
      *Type = X86::INTEL_CORE2; // "penryn"
      *Subtype = X86::INTEL_CORE2_45;
      break;
    case 0x1a: // Intel Core i7 processor and Intel Xeon processor. All
               // processors are manufactured using the 45 nm process.
    case 0x1e: // Intel(R) Core(TM) i7 CPU         870  @ 2.93GHz.
               // As found in a Summer 2010 model iMac.
    case 0x1f:
    case 0x2e:             // Nehalem EX
      *Type = X86::INTEL_COREI7; // "nehalem"
      *Subtype = X86::INTEL_COREI7_NEHALEM;
      break;
    case 0x25: // Intel Core i7, laptop version.
    case 0x2c: // Intel Core i7 processor and Intel Xeon processor. All
               // processors are manufactured using the 32 nm process.
    case 0x2f: // Westmere EX
      *Type = X86::INTEL_COREI7; // "westmere"
      *Subtype = X86::INTEL_COREI7_WESTMERE;
      break;
    case 0x2a: // Intel Core i7 processor. All processors are manufactured
               // using the 32 nm process.
    case 0x2d:
      *Type = X86::INTEL_COREI7; //"sandybridge"
      *Subtype = X86::INTEL_COREI7_SANDYBRIDGE;
      break;
    case 0x3a:
    case 0x3e:             // Ivy Bridge EP
      *Type = X86::INTEL_COREI7; // "ivybridge"
      *Subtype = X86::INTEL_COREI7_IVYBRIDGE;
      break;

    // Haswell:
    case 0x3c:
    case 0x3f:
    case 0x45:
    case 0x46:
      *Type = X86::INTEL_COREI7; // "haswell"
      *Subtype = X86::INTEL_COREI7_HASWELL;
      break;

    // Broadwell:
    case 0x3d:
    case 0x47:
    case 0x4f:
    case 0x56:
      *Type = X86::INTEL_COREI7; // "broadwell"
      *Subtype = X86::INTEL_COREI7_BROADWELL;
      break;

    // Skylake:
    case 0x4e: // Skylake mobile
    case 0x5e: // Skylake desktop
    case 0x8e: // Kaby Lake mobile
    case 0x9e: // Kaby Lake desktop
      *Type = X86::INTEL_COREI7; // "skylake"
      *Subtype = X86::INTEL_COREI7_SKYLAKE;
      break;

    // Skylake Xeon:
    case 0x55:
      *Type = X86::INTEL_COREI7;
      *Subtype = X86::INTEL_COREI7_SKYLAKE_AVX512; // "skylake-avx512"
      break;

    // Cannonlake:
    case 0x66:
      *Type = X86::INTEL_COREI7;
      *Subtype = X86::INTEL_COREI7_CANNONLAKE; // "cannonlake"
      break;

    case 0x1c: // Most 45 nm Intel Atom processors
    case 0x26: // 45 nm Atom Lincroft
    case 0x27: // 32 nm Atom Medfield
    case 0x35: // 32 nm Atom Midview
    case 0x36: // 32 nm Atom Midview
      *Type = X86::INTEL_BONNELL;
      break; // "bonnell"

    // Atom Silvermont codes from the Intel software optimization guide.
    case 0x37:
    case 0x4a:
    case 0x4d:
    case 0x5a:
    case 0x5d:
    case 0x4c: // really airmont
      *Type = X86::INTEL_SILVERMONT;
      break; // "silvermont"
    // Goldmont:
    case 0x5c: // Apollo Lake
    case 0x5f: // Denverton
      *Type = X86::INTEL_GOLDMONT;
      break; // "goldmont"
    case 0x7a:
      *Type = X86::INTEL_GOLDMONT_PLUS;
      break;
    case 0x57:
      *Type = X86::INTEL_KNL; // knl
      break;
    case 0x85:
      *Type = X86::INTEL_KNM; // knm
      break;

    default: // Unknown family 6 CPU, try to guess.
      if (Features & (1 << X86::FEATURE_AVX512VBMI)) {
        *Type = X86::INTEL_COREI7;
        *Subtype = X86::INTEL_COREI7_CANNONLAKE;
        break;
      }

      if (Features & (1 << X86::FEATURE_AVX512VL)) {
        *Type = X86::INTEL_COREI7;
        *Subtype = X86::INTEL_COREI7_SKYLAKE_AVX512;
        break;
      }

      if (Features & (1 << X86::FEATURE_AVX512ER)) {
        *Type = X86::INTEL_KNL; // knl
        break;
      }

      if (Features2 & (1 << (X86::FEATURE_CLFLUSHOPT - 32))) {
        if (Features2 & (1 << (X86::FEATURE_SHA - 32))) {
          *Type = X86::INTEL_GOLDMONT;
        } else {
          *Type = X86::INTEL_COREI7;
          *Subtype = X86::INTEL_COREI7_SKYLAKE;
        }
        break;
      }
      if (Features2 & (1 << (X86::FEATURE_ADX - 32))) {
        *Type = X86::INTEL_COREI7;
        *Subtype = X86::INTEL_COREI7_BROADWELL;
        break;
      }
      if (Features & (1 << X86::FEATURE_AVX2)) {
        *Type = X86::INTEL_COREI7;
        *Subtype = X86::INTEL_COREI7_HASWELL;
        break;
      }
      if (Features & (1 << X86::FEATURE_AVX)) {
        *Type = X86::INTEL_COREI7;
        *Subtype = X86::INTEL_COREI7_SANDYBRIDGE;
        break;
      }
      if (Features & (1 << X86::FEATURE_SSE4_2)) {
        if (Features2 & (1 << (X86::FEATURE_MOVBE - 32))) {
          *Type = X86::INTEL_SILVERMONT;
        } else {
          *Type = X86::INTEL_COREI7;
          *Subtype = X86::INTEL_COREI7_NEHALEM;
        }
        break;
      }
      if (Features & (1 << X86::FEATURE_SSE4_1)) {
        *Type = X86::INTEL_CORE2; // "penryn"
        *Subtype = X86::INTEL_CORE2_45;
        break;
      }
      if (Features & (1 << X86::FEATURE_SSSE3)) {
        if (Features2 & (1 << (X86::FEATURE_MOVBE - 32))) {
          *Type = X86::INTEL_BONNELL; // "bonnell"
        } else {
          *Type = X86::INTEL_CORE2; // "core2"
          *Subtype = X86::INTEL_CORE2_65;
        }
        break;
      }
      if (Features2 & (1 << (X86::FEATURE_EM64T - 32))) {
        *Type = X86::INTEL_CORE2; // "core2"
        *Subtype = X86::INTEL_CORE2_65;
        break;
      }
      if (Features & (1 << X86::FEATURE_SSE3)) {
        *Type = X86::INTEL_CORE_DUO;
        break;
      }
      if (Features & (1 << X86::FEATURE_SSE2)) {
        *Type = X86::INTEL_PENTIUM_M;
        break;
      }
      if (Features & (1 << X86::FEATURE_SSE)) {
        *Type = X86::INTEL_PENTIUM_III;
        break;
      }
      if (Features & (1 << X86::FEATURE_MMX)) {
        *Type = X86::INTEL_PENTIUM_II;
        break;
      }
      *Type = X86::INTEL_PENTIUM_PRO;
      break;
    }
    break;
  case 15: {
    if (Features2 & (1 << (X86::FEATURE_EM64T - 32))) {
      *Type = X86::INTEL_NOCONA;
      break;
    }
    if (Features & (1 << X86::FEATURE_SSE3)) {
      *Type = X86::INTEL_PRESCOTT;
      break;
    }
    *Type = X86::INTEL_PENTIUM_IV;
    break;
  }
  default:
    break; /*"generic"*/
  }
}